

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O1

bool __thiscall
AddrManImpl::Add_(AddrManImpl *this,vector<CAddress,_std::allocator<CAddress>_> *vAddr,
                 CNetAddr *source,seconds time_penalty)

{
  bool bVar1;
  Logger *this_00;
  pointer addr;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  unsigned_long local_60;
  int added;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  added = 0;
  addr = (vAddr->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
         super__Vector_impl_data._M_start;
  if (addr != (vAddr->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
              super__Vector_impl_data._M_finish) {
    do {
      bVar1 = AddSingle(this,addr,source,time_penalty);
      added = added + (uint)bVar1;
      addr = addr + 1;
    } while (addr != (vAddr->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
                     super__Vector_impl_data._M_finish);
  }
  if (0 < added) {
    this_00 = LogInstance();
    bVar1 = BCLog::Logger::WillLogCategoryLevel(this_00,ADDRMAN,Debug);
    if (bVar1) {
      local_60 = ((long)(vAddr->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(vAddr->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
                        super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
      CNetAddr::ToStringAddr_abi_cxx11_(&local_50,source);
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
      ;
      source_file._M_len = 0x5b;
      logging_function._M_str = "Add_";
      logging_function._M_len = 4;
      LogPrintFormatInternal<int,unsigned_long,std::__cxx11::string,int,int>
                (logging_function,source_file,0x2b0,ADDRMAN,Debug,
                 (ConstevalFormatString<5U>)0xf8f0fd,&added,&local_60,&local_50,&this->nTried,
                 &this->nNew);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return 0 < added;
}

Assistant:

bool AddrManImpl::Add_(const std::vector<CAddress>& vAddr, const CNetAddr& source, std::chrono::seconds time_penalty)
{
    int added{0};
    for (std::vector<CAddress>::const_iterator it = vAddr.begin(); it != vAddr.end(); it++) {
        added += AddSingle(*it, source, time_penalty) ? 1 : 0;
    }
    if (added > 0) {
        LogDebug(BCLog::ADDRMAN, "Added %i addresses (of %i) from %s: %i tried, %i new\n", added, vAddr.size(), source.ToStringAddr(), nTried, nNew);
    }
    return added > 0;
}